

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pragmaVtabFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
                    sqlite3_value **argv)

{
  byte bVar1;
  sqlite3_vtab *psVar2;
  int iVar3;
  void *pvVar4;
  sqlite3_vtab *psVar5;
  char *pcVar6;
  ulong uVar7;
  StrAccum local_58;
  
  psVar2 = pVtabCursor->pVtab;
  pragmaVtabCursorClear((PragmaVtabCursor *)pVtabCursor);
  if (0 < argc) {
    bVar1 = *(byte *)(*(long *)&psVar2[1].nRef + 9);
    uVar7 = 0;
    do {
      pvVar4 = sqlite3ValueText(argv[uVar7],'\x01');
      if (pvVar4 != (void *)0x0) {
        psVar5 = (sqlite3_vtab *)sqlite3_mprintf("%s",pvVar4);
        pVtabCursor[(ulong)((bVar1 & 0x20) == 0) + uVar7 + 3].pVtab = psVar5;
        if (psVar5 == (sqlite3_vtab *)0x0) goto LAB_00221df9;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
  }
  local_58.mxAlloc = *(u32 *)((long)&(psVar2[1].pModule)->xBegin + 4);
  local_58.zText = (char *)0x0;
  local_58.nChar = 0;
  local_58.nAlloc = 0;
  local_58.db = (sqlite3 *)0x0;
  local_58.zBase = (char *)0x0;
  local_58.accError = '\0';
  local_58.printfFlags = '\0';
  sqlite3StrAccumAppend(&local_58,"PRAGMA ",7);
  if (pVtabCursor[4].pVtab != (sqlite3_vtab *)0x0) {
    sqlite3XPrintf(&local_58,"%Q.");
  }
  sqlite3StrAccumAppendAll(&local_58,(char *)**(undefined8 **)&psVar2[1].nRef);
  if (pVtabCursor[3].pVtab != (sqlite3_vtab *)0x0) {
    sqlite3XPrintf(&local_58,"=%Q");
  }
  pcVar6 = sqlite3StrAccumFinish(&local_58);
  if (pcVar6 == (char *)0x0) {
LAB_00221df9:
    iVar3 = 7;
  }
  else {
    iVar3 = sqlite3LockAndPrepare
                      ((sqlite3 *)psVar2[1].pModule,pcVar6,-1,0x80,(Vdbe *)0x0,
                       (sqlite3_stmt **)(pVtabCursor + 1),(char **)0x0);
    sqlite3_free(pcVar6);
    if (iVar3 == 0) {
      iVar3 = pragmaVtabNext(pVtabCursor);
      return iVar3;
    }
    pcVar6 = sqlite3_errmsg((sqlite3 *)psVar2[1].pModule);
    pcVar6 = sqlite3_mprintf("%s",pcVar6);
    psVar2->zErrMsg = pcVar6;
  }
  return iVar3;
}

Assistant:

static int pragmaVtabFilter(
  sqlite3_vtab_cursor *pVtabCursor, 
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  PragmaVtab *pTab = (PragmaVtab*)(pVtabCursor->pVtab);
  int rc;
  int i, j;
  StrAccum acc;
  char *zSql;

  UNUSED_PARAMETER(idxNum);
  UNUSED_PARAMETER(idxStr);
  pragmaVtabCursorClear(pCsr);
  j = (pTab->pName->mPragFlg & PragFlg_Result1)!=0 ? 0 : 1;
  for(i=0; i<argc; i++, j++){
    const char *zText = (const char*)sqlite3_value_text(argv[i]);
    assert( j<ArraySize(pCsr->azArg) );
    assert( pCsr->azArg[j]==0 );
    if( zText ){
      pCsr->azArg[j] = sqlite3_mprintf("%s", zText);
      if( pCsr->azArg[j]==0 ){
        return SQLITE_NOMEM;
      }
    }
  }
  sqlite3StrAccumInit(&acc, 0, 0, 0, pTab->db->aLimit[SQLITE_LIMIT_SQL_LENGTH]);
  sqlite3StrAccumAppendAll(&acc, "PRAGMA ");
  if( pCsr->azArg[1] ){
    sqlite3XPrintf(&acc, "%Q.", pCsr->azArg[1]);
  }
  sqlite3StrAccumAppendAll(&acc, pTab->pName->zName);
  if( pCsr->azArg[0] ){
    sqlite3XPrintf(&acc, "=%Q", pCsr->azArg[0]);
  }
  zSql = sqlite3StrAccumFinish(&acc);
  if( zSql==0 ) return SQLITE_NOMEM;
  rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pCsr->pPragma, 0);
  sqlite3_free(zSql);
  if( rc!=SQLITE_OK ){
    pTab->base.zErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pTab->db));
    return rc;
  }
  return pragmaVtabNext(pVtabCursor);
}